

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.h
# Opt level: O1

void __thiscall
spvtools::AssemblyContext::AssemblyContext
          (AssemblyContext *this,spv_text text,MessageConsumer *consumer,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *ids_to_preserve
          )

{
  _Manager_type p_Var1;
  
  (this->named_ids_)._M_h._M_buckets = &(this->named_ids_)._M_h._M_single_bucket;
  (this->named_ids_)._M_h._M_bucket_count = 1;
  (this->named_ids_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->named_ids_)._M_h._M_element_count = 0;
  (this->named_ids_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->named_ids_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->named_ids_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->types_)._M_h._M_buckets = &(this->types_)._M_h._M_single_bucket;
  (this->types_)._M_h._M_bucket_count = 1;
  (this->types_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->types_)._M_h._M_element_count = 0;
  (this->types_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->types_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->types_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->value_types_)._M_h._M_buckets = &(this->value_types_)._M_h._M_single_bucket;
  (this->value_types_)._M_h._M_bucket_count = 1;
  (this->value_types_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->value_types_)._M_h._M_element_count = 0;
  (this->value_types_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->value_types_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->value_types_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->import_id_to_ext_inst_type_)._M_h._M_buckets =
       &(this->import_id_to_ext_inst_type_)._M_h._M_single_bucket;
  (this->import_id_to_ext_inst_type_)._M_h._M_bucket_count = 1;
  (this->import_id_to_ext_inst_type_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->import_id_to_ext_inst_type_)._M_h._M_element_count = 0;
  (this->import_id_to_ext_inst_type_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined8 *)((long)&(this->consumer_).super__Function_base._M_functor + 8) = 0;
  (this->consumer_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->current_position_).index = 0;
  *(undefined8 *)&(this->consumer_).super__Function_base._M_functor = 0;
  (this->current_position_).line = 0;
  (this->current_position_).column = 0;
  (this->import_id_to_ext_inst_type_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->import_id_to_ext_inst_type_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->consumer_)._M_invoker = (_Invoker_type)0x0;
  p_Var1 = (consumer->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->consumer_,(_Any_data *)consumer,__clone_functor);
    (this->consumer_)._M_invoker = consumer->_M_invoker;
    (this->consumer_).super__Function_base._M_manager = (consumer->super__Function_base)._M_manager;
  }
  this->text_ = text;
  this->bound_ = 1;
  this->next_id_ = 1;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->ids_to_preserve_)._M_t._M_impl.super__Rb_tree_header,
             &(ids_to_preserve->_M_t)._M_impl.super__Rb_tree_header);
  return;
}

Assistant:

AssemblyContext(spv_text text, const MessageConsumer& consumer,
                  std::set<uint32_t>&& ids_to_preserve = std::set<uint32_t>())
      : current_position_({}),
        consumer_(consumer),
        text_(text),
        bound_(1),
        next_id_(1),
        ids_to_preserve_(std::move(ids_to_preserve)) {}